

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall gl4cts::BasicUsageGS::Cleanup(BasicUsageGS *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->counter_buffer_);
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,this->xfb_buffer_);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->array_buffer_);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->vao_);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->prog_);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteBuffers(1, &counter_buffer_);
		glDeleteBuffers(2, xfb_buffer_);
		glDeleteBuffers(1, &array_buffer_);
		glDeleteVertexArrays(1, &vao_);
		glDeleteProgram(prog_);
		glUseProgram(0);
		return NO_ERROR;
	}